

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::PushColumnsBackground(void)

{
  ImVec4 *pIVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImDrawList *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar12;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  if (pIVar3->Count == 1) {
    return;
  }
  IVar11 = (pIVar2->ClipRect).Max;
  (pIVar3->HostBackupClipRect).Min = (pIVar2->ClipRect).Min;
  (pIVar3->HostBackupClipRect).Max = IVar11;
  IVar11 = (pIVar3->HostInitialClipRect).Max;
  fVar8 = (pIVar3->HostInitialClipRect).Min.x;
  fVar9 = (pIVar3->HostInitialClipRect).Min.y;
  fVar10 = (pIVar3->HostInitialClipRect).Max.x;
  fVar5 = (pIVar3->HostInitialClipRect).Min.x;
  fVar6 = (pIVar3->HostInitialClipRect).Min.y;
  fVar7 = (pIVar3->HostInitialClipRect).Max.x;
  fVar12 = (pIVar3->HostInitialClipRect).Max.y;
  (pIVar2->ClipRect).Min = (pIVar3->HostInitialClipRect).Min;
  (pIVar2->ClipRect).Max = IVar11;
  pIVar4 = pIVar2->DrawList;
  (pIVar4->_CmdHeader).ClipRect.x = fVar5;
  (pIVar4->_CmdHeader).ClipRect.y = fVar6;
  (pIVar4->_CmdHeader).ClipRect.z = fVar7;
  (pIVar4->_CmdHeader).ClipRect.w = fVar12;
  pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data +
           (long)(pIVar2->DrawList->_ClipRectStack).Size + -1;
  pIVar1->x = fVar8;
  pIVar1->y = fVar9;
  pIVar1->z = fVar10;
  pIVar1->w = fVar12;
  ImDrawListSplitter::SetCurrentChannel(&pIVar3->Splitter,pIVar2->DrawList,0);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }